

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O2

void __thiscall
iu_ExpressionNot_x_iutest_x_Monadic_Test::Body(iu_ExpressionNot_x_iutest_x_Monadic_Test *this)

{
  char *in_R9;
  string local_208;
  undefined1 local_1e8 [44];
  undefined4 local_1bc;
  AssertionResult iutest_ar;
  Fixed local_190;
  
  local_208._M_dataplus._M_p._0_1_ = 0;
  iutest::detail::ExpressionLHS<bool>::ExpressionLHS
            ((ExpressionLHS<bool> *)local_1e8,(bool *)&local_208);
  iutest::detail::ExpressionLHS<bool>::GetResult
            ((AssertionResult *)&local_190,(ExpressionLHS<bool> *)local_1e8,false);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_208,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((false))","false","true",
               in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x62,(char *)CONCAT71(local_208._M_dataplus._M_p._1_7_,
                                      local_208._M_dataplus._M_p._0_1_));
    local_1bc = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)local_1e8,&local_190);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_208._M_dataplus._M_p._0_1_ = 0;
  iutest::detail::ExpressionLHS<bool>::ExpressionLHS
            ((ExpressionLHS<bool> *)local_1e8,(bool *)&local_208);
  iutest::detail::ExpressionLHS<bool>::GetResult
            ((AssertionResult *)&local_190,(ExpressionLHS<bool> *)local_1e8,false);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_208,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((!f()))","false","true",
               in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,99,(char *)CONCAT71(local_208._M_dataplus._M_p._1_7_,
                                    local_208._M_dataplus._M_p._0_1_));
    local_1bc = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)local_1e8,&local_190);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(ExpressionNot, Monadic)
{
    IUTEST_EXPECT_NOT(false);
    IUTEST_EXPECT_NOT(!f());
}